

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readDbPage(PgHdr *pPg)

{
  long lVar1;
  u8 *dbFileVers;
  i64 iOffset;
  u32 iFrame;
  int rc;
  Pager *pPager;
  PgHdr *pPg_local;
  
  _iFrame = pPg->pPager;
  iOffset._4_4_ = 0;
  iOffset._0_4_ = 0;
  pPager = (Pager *)pPg;
  if ((_iFrame->pWal == (Wal *)0x0) ||
     (pPg_local._4_4_ = sqlite3WalFindFrame(_iFrame->pWal,pPg->pgno,(u32 *)&iOffset),
     pPg_local._4_4_ == 0)) {
    iOffset._4_4_ = 0;
    if ((u32)iOffset == 0) {
      iOffset._4_4_ =
           sqlite3OsRead(_iFrame->fd,*(void **)&pPager->exclusiveMode,_iFrame->pageSize,
                         (ulong)(pPager->nRec - 1) * (long)_iFrame->pageSize);
      if (iOffset._4_4_ == 0x20a) {
        iOffset._4_4_ = 0;
      }
    }
    else {
      iOffset._4_4_ =
           sqlite3WalReadFrame(_iFrame->pWal,(u32)iOffset,_iFrame->pageSize,
                               *(u8 **)&pPager->exclusiveMode);
    }
    if (pPager->nRec == 1) {
      if (iOffset._4_4_ == 0) {
        lVar1 = *(long *)&pPager->exclusiveMode;
        *(undefined8 *)_iFrame->dbFileVers = *(undefined8 *)(lVar1 + 0x18);
        *(undefined8 *)(_iFrame->dbFileVers + 8) = *(undefined8 *)(lVar1 + 0x20);
      }
      else {
        memset(_iFrame->dbFileVers,0xff,0x10);
      }
    }
    pPg_local._4_4_ = iOffset._4_4_;
  }
  return pPg_local._4_4_;
}

Assistant:

static int readDbPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  int rc = SQLITE_OK;          /* Return code */

#ifndef SQLITE_OMIT_WAL
  u32 iFrame = 0;              /* Frame of WAL containing pgno */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

  if( pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pPg->pgno, &iFrame);
    if( rc ) return rc;
  }
  if( iFrame ){
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame,pPager->pageSize,pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pPg->pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pPager->pageSize, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pPg->pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noise equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  CODEC1(pPager, pPg->pData, pPg->pgno, 3, rc = SQLITE_NOMEM_BKPT);

  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pPg->pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pPg->pgno, pager_pagehash(pPg)));

  return rc;
}